

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedInputStream::SetTotalBytesLimit
          (CodedInputStream *this,int total_bytes_limit,int warning_threshold)

{
  int *piVar1;
  int local_1c;
  int local_18;
  int current_position;
  int warning_threshold_local;
  int total_bytes_limit_local;
  CodedInputStream *this_local;
  
  local_18 = warning_threshold;
  current_position = total_bytes_limit;
  _warning_threshold_local = this;
  local_1c = CurrentPosition(this);
  piVar1 = std::max<int>(&local_1c,&current_position);
  this->total_bytes_limit_ = *piVar1;
  RecomputeBufferLimits(this);
  return;
}

Assistant:

void CodedInputStream::SetTotalBytesLimit(
    int total_bytes_limit, int warning_threshold) {
  (void) warning_threshold;

  // Make sure the limit isn't already past, since this could confuse other
  // code.
  int current_position = CurrentPosition();
  total_bytes_limit_ = std::max(current_position, total_bytes_limit);
  RecomputeBufferLimits();
}